

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  bool bVar2;
  ContextType CVar3;
  ApiType requiredApiType;
  RenderContext *pRVar4;
  ContextInfo *this_00;
  pointer ppVar5;
  TestError *pTVar6;
  string *local_558;
  undefined1 *local_3f8;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  allocator<char> local_281;
  undefined1 local_280 [8];
  string shader_source;
  int invalid_size_index;
  int num_invalid_size_declarations;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_250;
  iterator local_248;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_240;
  _supported_variable_types_map_const_iterator var_iterator;
  int var_type_index;
  allocator<char> local_222;
  allocator<char> local_221;
  allocator<char> local_220;
  allocator<char> local_21f;
  allocator<char> local_21e;
  allocator<char> local_21d;
  bool dynamic_indexing_supported;
  allocator<char> local_21b;
  allocator<char> local_21a;
  allocator<char> local_219;
  allocator<char> local_218;
  allocator<char> local_217;
  allocator<char> local_216;
  allocator<char> local_215 [20];
  allocator<char> local_201;
  string *local_200;
  string local_1f8 [8];
  string invalid_size_declarations [15];
  int num_var_types;
  TestShaderType tested_shader_type_local;
  ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  invalid_size_declarations[0xe].field_2._8_4_ = 0xf;
  local_200 = local_1f8;
  invalid_size_declarations[0xe].field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"[0][0][0][y]",&local_201);
  local_200 = (string *)(invalid_size_declarations[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[0].field_2._M_local_buf + 8),"[0][0][y][0]",
             local_215);
  local_200 = (string *)(invalid_size_declarations[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[1].field_2._M_local_buf + 8),"[0][y][0][0]",
             &local_216);
  local_200 = (string *)(invalid_size_declarations[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[2].field_2._M_local_buf + 8),"[y][0][0][0]",
             &local_217);
  local_200 = (string *)(invalid_size_declarations[3].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[3].field_2._M_local_buf + 8),"[0][0][y][y]",
             &local_218);
  local_200 = (string *)(invalid_size_declarations[4].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[4].field_2._M_local_buf + 8),"[0][y][0][y]",
             &local_219);
  local_200 = (string *)(invalid_size_declarations[5].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[5].field_2._M_local_buf + 8),"[y][0][0][y]",
             &local_21a);
  local_200 = (string *)(invalid_size_declarations[6].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[6].field_2._M_local_buf + 8),"[0][y][y][0]",
             &local_21b);
  local_200 = (string *)(invalid_size_declarations[7].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[7].field_2._M_local_buf + 8),"[y][0][y][0]",
             (allocator<char> *)&dynamic_indexing_supported);
  local_200 = (string *)(invalid_size_declarations[8].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[8].field_2._M_local_buf + 8),"[y][y][0][0]",
             &local_21d);
  local_200 = (string *)(invalid_size_declarations[9].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[9].field_2._M_local_buf + 8),"[0][y][y][y]",
             &local_21e);
  local_200 = (string *)(invalid_size_declarations[10].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[10].field_2._M_local_buf + 8),"[y][0][y][y]",
             &local_21f);
  local_200 = (string *)(invalid_size_declarations[0xb].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[0xb].field_2._M_local_buf + 8),"[y][y][0][y]",
             &local_220);
  local_200 = (string *)(invalid_size_declarations[0xc].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[0xc].field_2._M_local_buf + 8),"[y][y][y][0]",
             &local_221);
  local_200 = (string *)(invalid_size_declarations[0xd].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations[0xd].field_2._M_local_buf + 8),"[y][y][y][y]",
             &local_222);
  std::allocator<char>::~allocator(&local_222);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::~allocator(&local_220);
  std::allocator<char>::~allocator(&local_21f);
  std::allocator<char>::~allocator(&local_21e);
  std::allocator<char>::~allocator(&local_21d);
  std::allocator<char>::~allocator((allocator<char> *)&dynamic_indexing_supported);
  std::allocator<char>::~allocator(&local_21b);
  std::allocator<char>::~allocator(&local_21a);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::~allocator(&local_218);
  std::allocator<char>::~allocator(&local_217);
  std::allocator<char>::~allocator(&local_216);
  std::allocator<char>::~allocator(local_215);
  std::allocator<char>::~allocator(&local_201);
  bVar1 = false;
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id);
  CVar3.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(CVar3,requiredApiType);
  if (!bVar2) {
    pRVar4 = deqp::Context::getRenderContext
                       ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id)
    ;
    CVar3.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
    var_iterator._M_node._4_4_ = glu::ApiType::core(4,0);
    bVar2 = glu::contextSupports(CVar3,var_iterator._M_node._4_4_);
    if (!bVar2) {
      this_00 = deqp::Context::getContextInfo
                          ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).
                           context_id);
      bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_gpu_shader5");
      if (!bVar2) goto LAB_012e7e93;
    }
  }
  bVar1 = true;
LAB_012e7e93:
  var_iterator._M_node._0_4_ = 0;
  while( true ) {
    if ((int)invalid_size_declarations[0xe].field_2._8_4_ <= (int)var_iterator._M_node) {
      local_558 = (string *)(invalid_size_declarations[0xe].field_2._M_local_buf + 8);
      do {
        local_558 = local_558 + -0x20;
        std::__cxx11::string::~string(local_558);
      } while (local_558 != local_1f8);
      return;
    }
    local_248._M_node =
         (_Base_ptr)
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 *)supported_variable_types_map,
                (key_type *)(opaque_var_types + (long)(int)var_iterator._M_node * 4));
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_240,&local_248);
    _invalid_size_index =
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                *)supported_variable_types_map);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_250,(iterator *)&invalid_size_index);
    bVar2 = std::operator!=(&local_240,&local_250);
    if (!bVar2) break;
    shader_source.field_2._12_4_ = 0xf;
    for (shader_source.field_2._8_4_ = 0;
        (int)shader_source.field_2._8_4_ < (int)shader_source.field_2._12_4_;
        shader_source.field_2._8_4_ = shader_source.field_2._8_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_280,"int y = 1;\n",&local_281);
      std::allocator<char>::~allocator(&local_281);
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_240);
      std::operator+(&local_308,"uniform ",&(ppVar5->second).precision);
      std::operator+(&local_2e8,&local_308," ");
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_240);
      std::operator+(&local_2c8,&local_2e8,&(ppVar5->second).type);
      std::operator+(&local_2a8,&local_2c8," x[2][2][2][2];\n\n");
      std::__cxx11::string::operator+=((string *)local_280,(string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::operator+=((string *)local_280,"void main()\n");
      std::__cxx11::string::operator+=((string *)local_280,"{\n");
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_240);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,"    "
                     ,&(ppVar5->second).type_of_result_of_texture_function);
      std::operator+(&local_3a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,
                     " color = texture(x");
      std::operator+(&local_388,&local_3a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&invalid_size_declarations[(long)(int)shader_source.field_2._8_4_ + -1].
                             field_2 + 8));
      std::operator+(&local_368,&local_388,", ");
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_240);
      std::operator+(&local_348,&local_368,&(ppVar5->second).coord_param_for_texture_function);
      std::operator+(&local_328,&local_348,");\n");
      std::__cxx11::string::operator+=((string *)local_280,(string *)&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&cs);
      switch(invalid_size_declarations[0xe].field_2._12_4_) {
      case 0:
        break;
      case 1:
        std::__cxx11::string::operator+=((string *)local_280,"\n\tgl_Position = vec4(0.0);\n");
        break;
      case 2:
        break;
      case 3:
        std::__cxx11::string::operator+=((string *)local_280,(string *)emit_quad_abi_cxx11_);
        break;
      case 4:
        std::__cxx11::string::operator+=((string *)local_280,(string *)set_tesseation_abi_cxx11_);
        break;
      case 5:
        break;
      default:
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xd55);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::string::operator+=((string *)local_280,(string *)shader_end_abi_cxx11_);
      if (bVar1) {
        vs = (string *)empty_string_abi_cxx11_;
        tcs = (string *)default_vertex_shader_source_abi_cxx11_;
        tes = (string *)default_tc_shader_source_abi_cxx11_;
        gs = (string *)default_te_shader_source_abi_cxx11_;
        fs = (string *)default_geometry_shader_source_abi_cxx11_;
        local_3f8 = default_fragment_shader_source_abi_cxx11_;
        switch(invalid_size_declarations[0xe].field_2._12_4_) {
        case 0:
          local_3f8 = local_280;
          break;
        case 1:
          tcs = (string *)local_280;
          break;
        case 2:
          vs = (string *)local_280;
          tcs = (string *)empty_string_abi_cxx11_;
          tes = (string *)empty_string_abi_cxx11_;
          gs = (string *)empty_string_abi_cxx11_;
          fs = (string *)empty_string_abi_cxx11_;
          local_3f8 = empty_string_abi_cxx11_;
          break;
        case 3:
          fs = (string *)local_280;
          break;
        case 4:
          tes = (string *)local_280;
          break;
        case 5:
          gs = (string *)local_280;
          break;
        default:
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar6,"Invalid enum",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0xd59);
          __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
          super_TestNode._vptr_TestNode[10])(this,tcs,tes,gs,fs,local_3f8,vs,1,1);
      }
      else {
        (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
          super_TestNode._vptr_TestNode[8])
                  (this,(ulong)(uint)invalid_size_declarations[0xe].field_2._12_4_,local_280);
      }
      std::__cxx11::string::~string((string *)local_280);
    }
    var_iterator._M_node._0_4_ = (int)var_iterator._M_node + 1;
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0xd63);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ExpressionsDynamicIndexing2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int				  num_var_types				  = sizeof(opaque_var_types) / sizeof(opaque_var_types[0]);
	const std::string invalid_size_declarations[] = { "[0][0][0][y]", "[0][0][y][0]", "[0][y][0][0]", "[y][0][0][0]",
													  "[0][0][y][y]", "[0][y][0][y]", "[y][0][0][y]", "[0][y][y][0]",
													  "[y][0][y][0]", "[y][y][0][0]", "[0][y][y][y]", "[y][0][y][y]",
													  "[y][y][0][y]", "[y][y][y][0]", "[y][y][y][y]" };

	bool dynamic_indexing_supported = false;
	if (glu::contextSupports(this->context_id.getRenderContext().getType(), glu::ApiType::es(3, 2)) ||
		glu::contextSupports(this->context_id.getRenderContext().getType(), glu::ApiType::core(4, 0)) ||
		this->context_id.getContextInfo().isExtensionSupported("GL_EXT_gpu_shader5"))
	{
		dynamic_indexing_supported = true;
	}

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(opaque_var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			int num_invalid_size_declarations =
				sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);

			for (int invalid_size_index = 0; invalid_size_index < num_invalid_size_declarations; invalid_size_index++)
			{
				std::string shader_source = "int y = 1;\n";

				shader_source += "uniform " + var_iterator->second.precision + " " + var_iterator->second.type +
								 " x[2][2][2][2];\n\n";
				shader_source += "void main()\n";
				shader_source += "{\n";
				shader_source += ("    " + var_iterator->second.type_of_result_of_texture_function +
								  " color = texture(x" + invalid_size_declarations[invalid_size_index] + ", " +
								  var_iterator->second.coord_param_for_texture_function + ");\n");

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				if (dynamic_indexing_supported)
				{
					EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, true);
				}
				else
				{
					this->execute_negative_test(tested_shader_type, shader_source);
				}
			} /* for (int invalid_size_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}